

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Mapper2_is_cpu_address_in_range_Test::
Mapper2_is_cpu_address_in_range_Test(Mapper2_is_cpu_address_in_range_Test *this)

{
  Mapper2_is_cpu_address_in_range_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Mapper2_is_cpu_address_in_range_Test_003fb438;
  return;
}

Assistant:

TEST(Mapper2, is_cpu_address_in_range) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Mapper2)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    EXPECT_TRUE(rom->is_cpu_address_in_range(0x8000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xBFFFu));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xC000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xFFFFu));

    EXPECT_FALSE(rom->is_cpu_address_in_range(0x0000u));
    EXPECT_FALSE(rom->is_cpu_address_in_range(0x7FFFu));
}